

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O3

int MSH::check_read_state(fstream *infile)

{
  bool bVar1;
  
  bVar1 = ((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 1) != 0;
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Reached bad read state of msh file.",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  return (uint)bVar1;
}

Assistant:

int MSH::check_read_state(std::fstream &infile)
{
    if (infile.bad())
    {
        std::cout << "Error: Reached bad read state of msh file." << std::endl;
        return EXIT_FAILURE;
    }
    else
        return EXIT_SUCCESS;
    return EXIT_FAILURE;
}